

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void runputbuf(uchar *dstp,runsdef *val)

{
  void *__src;
  int iVar1;
  undefined1 *p;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  
  p = in_RDI + 1;
  *in_RDI = *in_RSI;
  switch(*in_RSI) {
  case 1:
    oswp4s(p,*(long *)(in_RSI + 8));
    break;
  case 2:
  case 10:
    oswp2(p,(uint)*(ushort *)(in_RSI + 8));
    break;
  case 3:
  case 7:
    __src = *(void **)(in_RSI + 8);
    iVar1 = osrp2(*(void **)(in_RSI + 8));
    memcpy(p,__src,(long)iVar1);
    break;
  case 0xd:
    oswp2(p,(uint)*(ushort *)(in_RSI + 8));
  }
  return;
}

Assistant:

static void runputbuf(uchar *dstp, runsdef *val)
{
    *dstp++ = val->runstyp;
    switch(val->runstyp)
    {
    case DAT_LIST:
    case DAT_SSTRING:
        memcpy(dstp, val->runsv.runsvstr, (size_t)osrp2(val->runsv.runsvstr));
        break;
        
    case DAT_NUMBER:
        oswp4s(dstp, val->runsv.runsvnum);
        break;
        
    case DAT_PROPNUM:
        oswp2(dstp, val->runsv.runsvprp);
        break;
        
    case DAT_OBJECT:
    case DAT_FNADDR:
        oswp2(dstp, val->runsv.runsvobj);
        break;
    }
}